

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O3

void __thiscall std::pmr::test_resource::print(test_resource *this)

{
  size_t sVar1;
  int iVar2;
  undefined8 uVar3;
  uint uVar4;
  Link *pLink;
  Link *pLVar5;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock_);
  if (iVar2 != 0) {
    uVar3 = std::__throw_system_error(iVar2);
    __clang_call_terminate(uVar3);
  }
  sVar1 = (this->m_name_)._M_len;
  if (sVar1 == 0) {
    puts(
        "\n==================================================\n                TEST RESOURCE STATE\n--------------------------------------------------"
        );
  }
  else {
    printf("\n==================================================\n                TEST RESOURCE %.*s STATE\n--------------------------------------------------\n"
           ,sVar1,(this->m_name_)._M_str);
  }
  printf("        Category\tBlocks\tBytes\n        --------\t------\t-----\n          IN USE\t%lld\t%lld\n             MAX\t%lld\t%lld\n           TOTAL\t%lld\t%lld\n      MISMATCHES\t%lld\n   BOUNDS ERRORS\t%lld\n   PARAM. ERRORS\t%lld\n--------------------------------------------------\n"
         ,(this->m_blocks_in_use_).super___atomic_base<long_long>._M_i,
         (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i,
         (this->m_max_blocks_).super___atomic_base<long_long>._M_i,
         (this->m_max_bytes_).super___atomic_base<long_long>._M_i,
         (this->m_total_blocks_).super___atomic_base<long_long>._M_i,
         (this->m_total_bytes_).super___atomic_base<unsigned_long>._M_i,
         (this->m_mismatches_).super___atomic_base<long_long>._M_i,
         (this->m_bounds_errors_).super___atomic_base<long_long>._M_i,
         (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i);
  if (this->m_list_->d_head_p != (Link *)0x0) {
    printf(" Indices of Outstanding Memory Allocations:\n ");
    pLVar5 = this->m_list_->d_head_p;
    if (pLVar5 != (Link *)0x0) {
      uVar4 = 0;
LAB_00102be8:
      do {
        printf("%lld\t",pLVar5->m_index_);
        pLVar5 = pLVar5->m_next_;
        if (uVar4 < 7) {
          uVar4 = uVar4 + 1;
          if (pLVar5 != (Link *)0x0) goto LAB_00102be8;
        }
        uVar4 = 0;
        printf("\n ");
      } while (pLVar5 != (Link *)0x0);
    }
  }
  fflush(_stdout);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock_);
  return;
}

Assistant:

void test_resource::print() const noexcept
{
    lock_guard guard{ m_lock_ };

    if (!m_name_.empty()) {
        printf("\n"
               "==================================================\n"
               "                TEST RESOURCE %.*s STATE\n"
               "--------------------------------------------------\n",
               static_cast<int>(m_name_.length()), m_name_.data());
    }
    else {
        printf("\n"
               "==================================================\n"
               "                TEST RESOURCE STATE\n"
               "--------------------------------------------------\n");
    }

    printf("        Category\tBlocks\tBytes\n"
           "        --------\t------\t-----\n"
           "          IN USE\t%lld\t%lld\n"
           "             MAX\t%lld\t%lld\n"
           "           TOTAL\t%lld\t%lld\n"
           "      MISMATCHES\t%lld\n"
           "   BOUNDS ERRORS\t%lld\n"
           "   PARAM. ERRORS\t%lld\n"
           "--------------------------------------------------\n",
           blocks_in_use(), bytes_in_use(),
           max_blocks(),    max_bytes(),
           total_blocks(),  total_bytes(),
           mismatches(),    bounds_errors(),
           bad_deallocate_params());

    if (m_list_->d_head_p) {
        printf(" Indices of Outstanding Memory Allocations:\n ");
        printList(*m_list_);
    }
    std::fflush(stdout);
}